

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkMiterQuantifyPis(Abc_Ntk_t *pNtk)

{
  Vec_Ptr_t *pVVar1;
  Abc_Ntk_t *pNtk_00;
  long lVar2;
  
  if (pNtk->nObjCounts[8] == pNtk->vBoxes->nSize) {
    pVVar1 = pNtk->vPis;
    if (0 < pVVar1->nSize) {
      lVar2 = 0;
      pNtk_00 = pNtk;
      do {
        pNtk = pNtk_00;
        if (*(int *)((long)pVVar1->pArray[lVar2] + 0x2c) != 0) {
          pNtk = Abc_NtkMiterQuantify(pNtk_00,(int)lVar2,1);
          Abc_NtkDelete(pNtk_00);
        }
        lVar2 = lVar2 + 1;
        pVVar1 = pNtk->vPis;
        pNtk_00 = pNtk;
      } while (lVar2 < pVVar1->nSize);
    }
    return pNtk;
  }
  __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                ,0x28d,"Abc_Ntk_t *Abc_NtkMiterQuantifyPis(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterQuantifyPis( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkTemp;
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk) );

    Abc_NtkForEachPi( pNtk, pObj, i )
    {
        if ( Abc_ObjFanoutNum(pObj) == 0 )
            continue;
        pNtk = Abc_NtkMiterQuantify( pNtkTemp = pNtk, i, 1 );
        Abc_NtkDelete( pNtkTemp );
    }

    return pNtk;
}